

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

void __thiscall DyndepParserTestBlankLineVersion::Run(DyndepParserTestBlankLineVersion *this)

{
  int iVar1;
  int iVar2;
  int fail_count;
  DyndepParserTestBlankLineVersion *this_local;
  
  iVar1 = testing::Test::AssertionFailures(g_current_test);
  DyndepParserTest::AssertParse(&this->super_DyndepParserTest,"\nninja_dyndep_version = 1\n");
  iVar2 = testing::Test::AssertionFailures(g_current_test);
  if (iVar1 != iVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(DyndepParserTest, BlankLineVersion) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"\n"
"ninja_dyndep_version = 1\n"));
}